

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeGame.cpp
# Opt level: O2

Maze * __thiscall MazeGame::CreateMaze(MazeGame *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  Room *room;
  Room *room_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Maze *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"MazeGame::CreateMaze()");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = (**this->_vptr_MazeGame)(this);
  this_00 = (Maze *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->_vptr_MazeGame[1])(this,1);
  room = (Room *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*this->_vptr_MazeGame[1])(this,2);
  room_00 = (Room *)CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*this->_vptr_MazeGame[3])(this,room,room_00);
  Maze::AddRoom(this_00,room);
  Maze::AddRoom(this_00,room_00);
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room,North,(MapSite *)CONCAT44(extraout_var_03,iVar2));
  Room::SetSide(room,East,(MapSite *)CONCAT44(extraout_var_02,iVar1));
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room,South,(MapSite *)CONCAT44(extraout_var_04,iVar2));
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room,West,(MapSite *)CONCAT44(extraout_var_05,iVar2));
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room_00,North,(MapSite *)CONCAT44(extraout_var_06,iVar2));
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room_00,East,(MapSite *)CONCAT44(extraout_var_07,iVar2));
  iVar2 = (*this->_vptr_MazeGame[2])(this);
  Room::SetSide(room_00,South,(MapSite *)CONCAT44(extraout_var_08,iVar2));
  Room::SetSide(room_00,West,(MapSite *)CONCAT44(extraout_var_02,iVar1));
  return this_00;
}

Assistant:

Maze* MazeGame::CreateMaze() {

    std::cout << "MazeGame::CreateMaze()" << std::endl;

    Maze* aMaze = MakeMaze();

    Room* r1 = MakeRoom(1);
    Room* r2 = MakeRoom(2);
    Door* theDoor = MakeDoor(r1, r2);

    aMaze->AddRoom(r1);
    aMaze->AddRoom(r2);

    r1->SetSide(North, MakeWall());
    r1->SetSide(East, theDoor);
    r1->SetSide(South, MakeWall());
    r1->SetSide(West, MakeWall());

    r2->SetSide(North, MakeWall());
    r2->SetSide(East, MakeWall());
    r2->SetSide(South, MakeWall());
    r2->SetSide(West, theDoor);

    return aMaze;
}